

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void FFSMarshalInstallMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  SstData p_Var1;
  long *plVar2;
  FFSMetadataInfoStruct *pFVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  FFSVarRec_conflict pFVar14;
  char *pcVar15;
  ulong uVar16;
  undefined *puVar17;
  ulong uVar18;
  long *plVar19;
  long lVar20;
  MetaArrayRec *meta_base;
  ulong *puVar21;
  TSMetadataMsg p_Var22;
  long lVar23;
  size_t sVar24;
  long *plVar25;
  FFSMetadataInfoStruct *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int Type;
  TSMetadataMsg local_50;
  void *local_48;
  void *local_40;
  size_t local_38;
  
  local_50 = MetaData;
  FFSMarshalInstallPreciousMetadata(Stream,MetaData);
  lVar20 = 0;
  do {
    sVar24 = (size_t)Stream->WriterCohortSize;
    if ((long)sVar24 <= lVar20) {
      return;
    }
    local_48 = Stream->ReaderMarshalData;
    if (local_48 == (void *)0x0) {
      pvVar6 = calloc(1,0x50);
      Stream->ReaderMarshalData = pvVar6;
      pvVar7 = calloc(0x18,sVar24);
      *(void **)((long)pvVar6 + 0x40) = pvVar7;
      pvVar7 = calloc(8,sVar24);
      *(void **)((long)pvVar6 + 0x20) = pvVar7;
      pvVar7 = calloc(8,sVar24);
      *(void **)((long)pvVar6 + 0x28) = pvVar7;
      pvVar7 = calloc(8,sVar24);
      *(void **)((long)pvVar6 + 0x30) = pvVar7;
      pvVar7 = calloc(8,sVar24);
      *(void **)((long)pvVar6 + 0x38) = pvVar7;
      local_48 = pvVar6;
    }
    p_Var22 = local_50;
    pcVar10 = local_50->Metadata[lVar20].block;
    if (pcVar10 == (char *)0x0) {
      fprintf(_stderr,
              "FAILURE!   MetaData->Metadata[WriterRank]->block == NULL for WriterRank = %d\n",
              lVar20);
      pcVar10 = p_Var22->Metadata[lVar20].block;
    }
    uVar8 = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,pcVar10);
    iVar4 = FFShas_conversion(uVar8);
    if (iVar4 == 0) {
      uVar9 = FMContext_from_FFS(Stream->ReaderFFSContext);
      uVar9 = FMformat_from_ID(uVar9,p_Var22->Metadata[lVar20].block);
      uVar9 = format_list_of_FMFormat(uVar9);
      uVar9 = FMcopy_struct_list(uVar9);
      FMlocalize_structs(uVar9);
      establish_conversion(Stream->ReaderFFSContext,uVar8,uVar9);
      p_Var22 = local_50;
      FMfree_struct_list(uVar9);
    }
    iVar4 = FFSdecode_in_place_possible(uVar8);
    p_Var1 = p_Var22->Metadata;
    if (iVar4 == 0) {
      sVar24 = FFS_est_decode_length
                         (Stream->ReaderFFSContext,p_Var1[lVar20].block,p_Var1[lVar20].DataSize);
      local_68 = (FFSMetadataInfoStruct *)malloc(sVar24);
      FFSdecode_to_buffer(Stream->ReaderFFSContext,p_Var22->Metadata[lVar20].block,local_68);
    }
    else {
      FFSdecode_in_place(Stream->ReaderFFSContext,p_Var1[lVar20].block,&local_68);
    }
    if (BuildVarList_DumpMetadata == 0xffffffff) {
      pcVar10 = getenv("SstDumpMetadata");
      BuildVarList_DumpMetadata = (uint)(pcVar10 != (char *)0x0);
    }
    if ((BuildVarList_DumpMetadata != 0) && (Stream->Rank == 0)) {
      printf("\nIncomingMetadatablock from WriterRank %d is %p :\n",lVar20,local_68);
      uVar9 = FMFormat_of_original(uVar8);
      FMdump_data(uVar9,local_68,0xfa000);
      puts("\n");
    }
    lVar11 = FMFormat_of_original(uVar8);
    for (plVar25 = (long *)((long)Stream->ReaderMarshalData + 0x48); plVar25 = (long *)*plVar25,
        plVar25 != (long *)0x0; plVar25 = plVar25 + 2) {
      if (*plVar25 == lVar11) goto LAB_006c573d;
    }
    lVar12 = FMFormat_of_original(uVar8);
    local_40 = Stream->ReaderMarshalData;
    lVar13 = format_list_of_FMFormat(lVar12);
    lVar11 = *(long *)(lVar13 + 8) + -0x18;
    lVar13 = *(long *)(lVar13 + 8) + 0x10;
    do {
      lVar23 = lVar13;
      pcVar10 = *(char **)(lVar11 + 0x18);
      lVar11 = lVar11 + 0x18;
      iVar4 = strncmp(pcVar10,"BitField",8);
      lVar13 = lVar23 + 0x18;
    } while (iVar4 == 0);
    while ((pcVar10 != (char *)0x0 && (iVar4 = strncmp(pcVar10,"DataBlockSize",8), iVar4 == 0))) {
      pcVar10 = *(char **)(lVar23 + 8);
      lVar23 = lVar23 + 0x18;
    }
    sVar24 = 0x38;
    plVar25 = (long *)malloc(0x38);
    *plVar25 = lVar12;
    iVar4 = 0;
    lVar11 = 0x30;
    iVar5 = 0;
    while (pcVar10 != (char *)0x0) {
      lVar13 = (long)iVar5 * 0x18;
      local_60 = iVar5;
      local_5c = iVar4;
      local_38 = sVar24;
      plVar25 = (long *)realloc(plVar25,sVar24);
      *(int *)((long)plVar25 + lVar11 + -0x18) = iVar5;
      *(undefined4 *)((long)plVar25 + lVar11 + -0x14) = *(undefined4 *)(lVar23 + 4 + lVar13);
      pcVar10 = *(char **)(lVar23 + -0x10 + lVar13);
      sVar24 = strlen(pcVar10);
      iVar4 = strcmp("Dims",pcVar10 + (sVar24 - 4));
      if (iVar4 == 0) {
        *(undefined4 *)((long)plVar25 + lVar11 + -8) = 1;
        pcVar15 = strchr(pcVar10,0x5f);
        pcVar15 = strchr(pcVar15 + 1,0x5f);
        __isoc99_sscanf(pcVar10,"SST%d_%d_",&local_58,&Type);
        iVar5 = Type;
        iVar4 = local_58;
        pcVar10 = strdup(pcVar15 + 1);
        sVar24 = strlen(pcVar10);
        pcVar10[sVar24 - 4] = '\0';
        pFVar14 = LookupVarByName(Stream,pcVar10);
        if (pFVar14 == (FFSVarRec_conflict)0x0) {
          pFVar14 = CreateVarRec(Stream,pcVar10);
          pFVar14->Type = iVar5;
          pFVar14->ElementSize = iVar4;
          *(int *)((long)plVar25 + lVar11) = iVar4;
        }
        iVar5 = local_60 + 5;
        free(pcVar10);
        *(FFSVarRec_conflict *)((long)plVar25 + lVar11 + -0x10) = pFVar14;
      }
      else {
        pcVar10 = strdup(pcVar10 + 4);
        *(undefined4 *)((long)plVar25 + lVar11 + -8) = 0;
        pFVar14 = LookupVarByName(Stream,pcVar10);
        if (pFVar14 == (FFSVarRec_conflict)0x0) {
          pcVar15 = *(char **)(lVar23 + -8 + lVar13);
          iVar4 = *(int *)(lVar23 + lVar13);
          iVar5 = strcmp(pcVar15,"integer");
          if (iVar5 == 0) {
            if (7 < iVar4 - 1U) goto LAB_006c56c6;
            puVar17 = &DAT_006dbd14;
LAB_006c56c0:
            iVar4 = *(int *)(puVar17 + (ulong)(iVar4 - 1) * 4);
          }
          else {
            iVar5 = strcmp(pcVar15,"unsigned integer");
            if (iVar5 == 0) {
              if (iVar4 - 1U < 8) {
                puVar17 = &DAT_006dbd34;
                goto LAB_006c56c0;
              }
LAB_006c56c6:
              iVar4 = 0;
            }
            else {
              iVar5 = strcmp(pcVar15,"double");
              if ((iVar5 == 0) || (iVar5 = strcmp(pcVar15,"float"), iVar5 == 0)) {
                iVar4 = (iVar4 != 4) + 9;
              }
              else {
                iVar5 = strcmp(pcVar15,"complex4");
                iVar4 = 0xc;
                if (iVar5 != 0) {
                  iVar5 = strcmp(pcVar15,"complex8");
                  iVar4 = 0xd;
                  if (iVar5 != 0) goto LAB_006c56c6;
                }
              }
            }
          }
          pFVar14 = CreateVarRec(Stream,pcVar10);
          pFVar14->DimCount = 0;
          *(int *)((long)plVar25 + lVar11 + -4) = iVar4;
          pFVar14->Type = iVar4;
        }
        iVar4 = *(int *)(lVar23 + lVar13);
        pFVar14->ElementSize = iVar4;
        *(int *)((long)plVar25 + lVar11) = iVar4;
        *(FFSVarRec_conflict *)((long)plVar25 + lVar11 + -0x10) = pFVar14;
        free(pcVar10);
        iVar5 = local_60 + 1;
      }
      iVar4 = local_5c + 1;
      lVar11 = lVar11 + 0x20;
      sVar24 = local_38 + 0x38;
      pcVar10 = *(char **)(lVar23 + -0x10 + (long)iVar5 * 0x18);
    }
    *(int *)(plVar25 + 1) = iVar4;
    plVar25[2] = *(long *)((long)local_40 + 0x48);
    *(long **)((long)local_40 + 0x48) = plVar25;
LAB_006c573d:
    *(FFSMetadataInfoStruct **)(*(long *)((long)local_48 + 0x20) + lVar20 * 8) = local_68;
    plVar19 = plVar25 + 5;
    for (lVar11 = 0; pFVar3 = local_68, lVar11 < (int)plVar25[1]; lVar11 = lVar11 + 1) {
      iVar4 = *(int *)((long)plVar19 + -0xc);
      plVar2 = (long *)plVar19[-1];
      iVar5 = FFSBitfieldTest(local_68,(int)lVar11);
      if (iVar5 != 0) {
        puVar21 = (ulong *)((long)&pFVar3->BitFieldCount + (long)iVar4);
        if ((int)*plVar19 == 0) {
          if (*plVar2 == 0) {
            pvVar6 = (*Stream->VarSetupUpcall)
                               (Stream->SetupUpcallReader,(char *)plVar2[1],(int)plVar2[4],puVar21);
            *plVar2 = (long)pvVar6;
          }
        }
        else {
          if ((1 < *puVar21) &&
             (Stream->WriterConfigParams->IsRowMajor != Stream->ConfigParams->IsRowMajor)) {
            ReverseDimensions((size_t *)puVar21[2],(int)*puVar21);
            ReverseDimensions((size_t *)puVar21[3],(int)*puVar21);
            ReverseDimensions((size_t *)puVar21[4],(int)*puVar21);
          }
          if (lVar20 == 0) {
            plVar2[5] = puVar21[2];
          }
          uVar18 = *puVar21;
          if (*plVar2 == 0) {
            pvVar6 = (*Stream->ArraySetupUpcall)
                               (Stream->SetupUpcallReader,(char *)plVar2[1],(int)plVar2[4],
                                (int)uVar18,(size_t *)puVar21[2],(size_t *)puVar21[4],
                                (size_t *)puVar21[3]);
            *plVar2 = (long)pvVar6;
            uVar18 = *puVar21;
          }
          plVar2[3] = uVar18;
          uVar16 = 1;
          if (uVar18 != 0) {
            uVar16 = puVar21[1] / uVar18;
          }
          *(ulong *)(plVar2[7] + lVar20 * 8) = uVar16;
          *(ulong *)(plVar2[8] + lVar20 * 8) = puVar21[4];
          *(ulong *)(plVar2[9] + lVar20 * 8) = puVar21[3];
          if (lVar20 == 0) {
            *(undefined8 *)plVar2[6] = 0;
          }
          if (lVar20 < (long)Stream->WriterCohortSize + -1) {
            *(long *)(plVar2[6] + 8 + lVar20 * 8) =
                 *(long *)(plVar2[7] + lVar20 * 8) + *(long *)(plVar2[6] + lVar20 * 8);
          }
        }
        *(long *)(plVar2[2] + lVar20 * 8) = (long)iVar4;
      }
      plVar19 = plVar19 + 4;
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

extern void FFSMarshalInstallMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    FFSMarshalInstallPreciousMetadata(Stream, MetaData);

    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        BuildVarList(Stream, MetaData, i);
    }
}